

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCCtxSize_internal(int compressionLevel)

{
  ZSTD_compressionParameters cParams_00;
  ZSTD_compressionParameters cParams_01;
  size_t sVar1;
  undefined8 in_stack_ffffffffffffffb4;
  size_t local_40;
  undefined1 local_38 [8];
  ZSTD_compressionParameters cParams;
  size_t largestSize;
  int tier;
  int compressionLevel_local;
  
  stack0xffffffffffffffe8 = 0;
  for (largestSize._0_4_ = 0; (int)largestSize < 4; largestSize._0_4_ = (int)largestSize + 1) {
    ZSTD_getCParams_internal
              ((ZSTD_compressionParameters *)local_38,compressionLevel,
               ZSTD_estimateCCtxSize_internal::srcSizeTiers[(int)largestSize],0,
               ZSTD_cpm_noAttachDict);
    cParams_00.hashLog = cParams.hashLog;
    cParams_00.searchLog = cParams.searchLog;
    cParams_00.windowLog = cParams.windowLog;
    cParams_00.chainLog = cParams.chainLog;
    cParams_00.minMatch = cParams.minMatch;
    cParams_00.targetLength = (int)in_stack_ffffffffffffffb4;
    cParams_00.strategy = (int)((ulong)in_stack_ffffffffffffffb4 >> 0x20);
    sVar1 = ZSTD_estimateCCtxSize_usingCParams(cParams_00);
    if (stack0xffffffffffffffe8 < sVar1) {
      cParams_01.hashLog = cParams.hashLog;
      cParams_01.searchLog = cParams.searchLog;
      cParams_01.windowLog = cParams.windowLog;
      cParams_01.chainLog = cParams.chainLog;
      cParams_01.minMatch = cParams.minMatch;
      cParams_01.targetLength = (int)in_stack_ffffffffffffffb4;
      cParams_01.strategy = (int)((ulong)in_stack_ffffffffffffffb4 >> 0x20);
      local_40 = ZSTD_estimateCCtxSize_usingCParams(cParams_01);
    }
    else {
      local_40 = stack0xffffffffffffffe8;
    }
    unique0x00012000 = local_40;
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static size_t ZSTD_estimateCCtxSize_internal(int compressionLevel)
{
    int tier = 0;
    size_t largestSize = 0;
    static const unsigned long long srcSizeTiers[4] = {16 KB, 128 KB, 256 KB, ZSTD_CONTENTSIZE_UNKNOWN};
    for (; tier < 4; ++tier) {
        /* Choose the set of cParams for a given level across all srcSizes that give the largest cctxSize */
        ZSTD_compressionParameters const cParams = ZSTD_getCParams_internal(compressionLevel, srcSizeTiers[tier], 0, ZSTD_cpm_noAttachDict);
        largestSize = MAX(ZSTD_estimateCCtxSize_usingCParams(cParams), largestSize);
    }
    return largestSize;
}